

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymesh_info.cpp
# Opt level: O0

ostream * CMU462::Collada::operator<<(ostream *os,PolymeshInfo *polymesh)

{
  ostream *poVar1;
  size_type sVar2;
  PolymeshInfo *polymesh_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"PolymeshInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)&(polymesh->super_Instance).name);
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)&(polymesh->super_Instance).id);
  std::operator<<(poVar1,")");
  std::operator<<(os," [");
  poVar1 = std::operator<<(os," num_polygons=");
  sVar2 = std::vector<CMU462::Collada::Polygon,_std::allocator<CMU462::Collada::Polygon>_>::size
                    (&polymesh->polygons);
  std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(os," num_vertices=");
  sVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size
                    (&polymesh->vertices);
  std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(os," num_normals=");
  sVar2 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size(&polymesh->normals)
  ;
  std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(os," num_texcoords=");
  sVar2 = std::vector<CMU462::Vector2D,_std::allocator<CMU462::Vector2D>_>::size
                    (&polymesh->texcoords);
  std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(os," ]");
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const PolymeshInfo& polymesh ) {

  os << "PolymeshInfo: " << polymesh.name << " (id:" << polymesh.id << ")";

  os << " [";

    os << " num_polygons="  << polymesh.polygons.size();
    os << " num_vertices="  << polymesh.vertices.size();
    os << " num_normals="   << polymesh.normals.size();
    os << " num_texcoords=" << polymesh.texcoords.size();

  os << " ]";

  return os;

}